

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::Private_Impl(Private_Impl *this)

{
  Private_Impl *in_RDI;
  PORT_USERDATA *in_stack_fffffffffffffff0;
  
  PORT_USERDATA::PORT_USERDATA(in_stack_fffffffffffffff0);
  in_RDI->format = (MMAL_ES_FORMAT_T *)0x0;
  in_RDI->camera_video_port = (MMAL_PORT_T *)0x0;
  in_RDI->_isOpened = false;
  in_RDI->_isCapturing = false;
  setDefaultStateParams(in_RDI);
  return;
}

Assistant:

Private_Impl::Private_Impl() {
            camera_video_port = NULL;
//             camera_still_port = NULL;
            _isOpened=false;
            _isCapturing=false;
            //set default state params
            setDefaultStateParams();
        }